

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O1

bool __thiscall
ON_Font::SetFontCharacteristics
          (ON_Font *this,wchar_t *gdi_logfont_name,Weight font_weight,Style font_style,
          Stretch font_stretch,bool bUnderlined,bool bStrikethrough,double linefeed_ratio,
          uint logfont_charset)

{
  bool bVar1;
  double in_XMM1_Qa;
  
  bVar1 = SetFontCharacteristics
                    (this,0.0,gdi_logfont_name,font_weight,font_style,font_stretch,bUnderlined,
                     bStrikethrough,in_XMM1_Qa,logfont_charset);
  return bVar1;
}

Assistant:

bool ON_Font::SetFontCharacteristics(
  const wchar_t* gdi_logfont_name,
  ON_Font::Weight font_weight,
  ON_Font::Style font_style,
  ON_Font::Stretch font_stretch,
  bool bUnderlined,
  bool bStrikethrough,
  double linefeed_ratio,
  unsigned int logfont_charset
)
{
  return SetFontCharacteristics(
    0.0,
    gdi_logfont_name,
    font_weight,
    font_style,
    font_stretch,
    bUnderlined,
    bStrikethrough,
    linefeed_ratio,
    logfont_charset
  );
}